

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

TensorValue_RepeatedStrings *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::MILSpec::TensorValue_RepeatedStrings>(Arena *arena)

{
  TensorValue_RepeatedStrings *this;
  
  if (arena == (Arena *)0x0) {
    this = (TensorValue_RepeatedStrings *)operator_new(0x30);
    CoreML::Specification::MILSpec::TensorValue_RepeatedStrings::TensorValue_RepeatedStrings
              (this,(Arena *)0x0,false);
  }
  else {
    this = (TensorValue_RepeatedStrings *)
           AllocateAlignedWithHook
                     (arena,0x30,
                      (type_info *)
                      &CoreML::Specification::MILSpec::TensorValue_RepeatedStrings::typeinfo);
    CoreML::Specification::MILSpec::TensorValue_RepeatedStrings::TensorValue_RepeatedStrings
              (this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }